

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx2::
     BVHNIntersectorKHybrid<4,_8,_16777232,_false,_embree::avx2::ArrayIntersectorK_1<8,_embree::avx2::TriangleMvMBIntersectorKMoeller<4,_8,_true>_>,_true>
     ::occluded(vint<8> *valid_i,Intersectors *This,RayK<8> *ray,RayQueryContext *context)

{
  undefined4 uVar1;
  undefined4 uVar2;
  Geometry *pGVar3;
  RTCFilterFunctionN p_Var4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  undefined4 uVar12;
  size_t k;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  int iVar27;
  AABBNodeMB4D *node1;
  ulong uVar28;
  long lVar29;
  undefined1 (*pauVar30) [32];
  NodeRef root;
  ulong uVar31;
  ulong uVar32;
  ulong *puVar33;
  uint uVar34;
  undefined4 uVar35;
  ulong unaff_R15;
  ulong uVar36;
  bool bVar37;
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 in_ZMM1 [64];
  undefined1 auVar46 [64];
  float fVar47;
  float fVar59;
  float fVar60;
  undefined1 auVar48 [16];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  float fVar61;
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [64];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [64];
  Precalculations pre;
  vbool<8> terminated;
  RTCFilterFunctionNArguments args;
  TravRayK<8,_false> tray;
  NodeRef stack_node [241];
  vfloat<8> stack_near [241];
  Precalculations local_2c51;
  ulong local_2c50;
  RayQueryContext *local_2c48;
  undefined1 local_2c40 [56];
  RayK<8> *local_2c08;
  undefined1 local_2c00 [32];
  BVH *local_2bd0;
  Intersectors *local_2bc8;
  undefined1 local_2bc0 [32];
  undefined1 local_2ba0 [32];
  undefined8 local_2b80;
  undefined8 uStack_2b78;
  undefined8 uStack_2b70;
  undefined8 uStack_2b68;
  undefined1 local_2b60 [32];
  undefined1 local_2b40 [32];
  RTCFilterFunctionNArguments local_2b10;
  undefined1 local_2ae0 [32];
  undefined1 local_2ac0 [32];
  undefined1 local_2aa0 [32];
  undefined1 local_2a80 [32];
  undefined8 local_2a60;
  undefined8 uStack_2a58;
  undefined8 uStack_2a50;
  undefined8 uStack_2a48;
  undefined8 local_2a40;
  undefined8 uStack_2a38;
  undefined8 uStack_2a30;
  undefined8 uStack_2a28;
  undefined8 local_2a20;
  undefined8 uStack_2a18;
  undefined8 uStack_2a10;
  undefined8 uStack_2a08;
  undefined1 local_2a00 [32];
  undefined1 local_29e0 [8];
  float fStack_29d8;
  float fStack_29d4;
  float fStack_29d0;
  float fStack_29cc;
  float fStack_29c8;
  undefined1 local_29c0 [8];
  float fStack_29b8;
  float fStack_29b4;
  float fStack_29b0;
  float fStack_29ac;
  float fStack_29a8;
  undefined1 local_29a0 [8];
  float fStack_2998;
  float fStack_2994;
  float fStack_2990;
  float fStack_298c;
  float fStack_2988;
  undefined1 local_2980 [32];
  anon_union_96_2_4062524c_for_Vec3<embree::vfloat_impl<8>_>_1 local_2960;
  undefined1 local_2900 [32];
  undefined1 local_28e0 [32];
  undefined1 local_28c0 [32];
  undefined1 local_28a0 [32];
  undefined1 local_2880 [32];
  undefined1 local_2860 [32];
  float local_2840;
  float fStack_283c;
  float fStack_2838;
  float fStack_2834;
  float fStack_2830;
  float fStack_282c;
  float fStack_2828;
  undefined4 uStack_2824;
  float local_2820;
  float fStack_281c;
  float fStack_2818;
  float fStack_2814;
  float fStack_2810;
  float fStack_280c;
  float fStack_2808;
  undefined4 uStack_2804;
  float local_2800;
  float fStack_27fc;
  float fStack_27f8;
  float fStack_27f4;
  float fStack_27f0;
  float fStack_27ec;
  float fStack_27e8;
  undefined4 uStack_27e4;
  undefined1 local_27e0 [32];
  undefined1 local_27c0 [32];
  undefined1 local_27a0 [32];
  undefined1 local_2780 [32];
  undefined1 local_2760 [32];
  undefined8 local_2740;
  undefined8 uStack_2738;
  undefined8 uStack_2730;
  undefined8 uStack_2728;
  undefined8 local_2720;
  undefined8 uStack_2718;
  undefined8 uStack_2710;
  undefined8 uStack_2708;
  undefined1 local_2700 [32];
  float local_26e0;
  float fStack_26dc;
  float fStack_26d8;
  float fStack_26d4;
  float fStack_26d0;
  float fStack_26cc;
  float fStack_26c8;
  undefined4 uStack_26c4;
  float local_26c0;
  float fStack_26bc;
  float fStack_26b8;
  float fStack_26b4;
  float fStack_26b0;
  float fStack_26ac;
  float fStack_26a8;
  undefined4 uStack_26a4;
  undefined1 local_26a0 [32];
  undefined1 local_2680 [32];
  undefined1 local_2660 [32];
  undefined1 local_2640 [32];
  undefined8 local_2610;
  size_t local_2608;
  ulong local_2600 [240];
  undefined1 local_1e80 [32];
  undefined1 local_1e60 [32];
  undefined1 local_1e40 [7696];
  
  local_2bd0 = (BVH *)This->ptr;
  local_2608 = (local_2bd0->root).ptr;
  if (local_2608 != 8) {
    auVar63 = vpcmpeqd_avx2(in_ZMM1._0_32_,in_ZMM1._0_32_);
    auVar48 = ZEXT816(0) << 0x40;
    auVar50 = vpcmpeqd_avx2(auVar63,(undefined1  [32])valid_i->field_0);
    auVar63 = vcmpps_avx(*(undefined1 (*) [32])(ray + 0x100),ZEXT1632(auVar48),5);
    auVar49 = auVar50 & auVar63;
    if ((((((((auVar49 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar49 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar49 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar49 >> 0x7f,0) != '\0') ||
          (auVar49 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar49 >> 0xbf,0) != '\0') ||
        (auVar49 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar49[0x1f] < '\0')
    {
      auVar63 = vandps_avx(auVar63,auVar50);
      auVar5 = vpackssdw_avx(auVar63._0_16_,auVar63._16_16_);
      local_2960._0_4_ = *(undefined4 *)ray;
      local_2960._4_4_ = *(undefined4 *)(ray + 4);
      local_2960._8_4_ = *(undefined4 *)(ray + 8);
      local_2960._12_4_ = *(undefined4 *)(ray + 0xc);
      local_2960._16_4_ = *(undefined4 *)(ray + 0x10);
      local_2960._20_4_ = *(undefined4 *)(ray + 0x14);
      local_2960._24_4_ = *(undefined4 *)(ray + 0x18);
      local_2960._28_4_ = *(undefined4 *)(ray + 0x1c);
      local_2960._32_4_ = *(undefined4 *)(ray + 0x20);
      local_2960._36_4_ = *(undefined4 *)(ray + 0x24);
      local_2960._40_4_ = *(undefined4 *)(ray + 0x28);
      local_2960._44_4_ = *(undefined4 *)(ray + 0x2c);
      local_2960._48_4_ = *(undefined4 *)(ray + 0x30);
      local_2960._52_4_ = *(undefined4 *)(ray + 0x34);
      local_2960._56_4_ = *(undefined4 *)(ray + 0x38);
      local_2960._60_4_ = *(undefined4 *)(ray + 0x3c);
      local_2960._64_4_ = *(undefined4 *)(ray + 0x40);
      local_2960._68_4_ = *(undefined4 *)(ray + 0x44);
      local_2960._72_4_ = *(undefined4 *)(ray + 0x48);
      local_2960._76_4_ = *(undefined4 *)(ray + 0x4c);
      local_2960._80_4_ = *(undefined4 *)(ray + 0x50);
      local_2960._84_4_ = *(undefined4 *)(ray + 0x54);
      local_2960._88_4_ = *(undefined4 *)(ray + 0x58);
      local_2960._92_4_ = *(undefined4 *)(ray + 0x5c);
      local_2900 = *(undefined1 (*) [32])(ray + 0x80);
      local_28e0 = *(undefined1 (*) [32])(ray + 0xa0);
      local_28c0 = *(undefined1 (*) [32])(ray + 0xc0);
      local_2aa0._8_4_ = 0x7fffffff;
      local_2aa0._0_8_ = 0x7fffffff7fffffff;
      local_2aa0._12_4_ = 0x7fffffff;
      local_2aa0._16_4_ = 0x7fffffff;
      local_2aa0._20_4_ = 0x7fffffff;
      local_2aa0._24_4_ = 0x7fffffff;
      local_2aa0._28_4_ = 0x7fffffff;
      auVar94._8_4_ = 0x219392ef;
      auVar94._0_8_ = 0x219392ef219392ef;
      auVar94._12_4_ = 0x219392ef;
      auVar94._16_4_ = 0x219392ef;
      auVar94._20_4_ = 0x219392ef;
      auVar94._24_4_ = 0x219392ef;
      auVar94._28_4_ = 0x219392ef;
      auVar63 = vandps_avx(local_2aa0,local_2900);
      auVar63 = vcmpps_avx(auVar63,auVar94,1);
      auVar49 = vblendvps_avx(local_2900,auVar94,auVar63);
      auVar63 = vandps_avx(local_2aa0,local_28e0);
      auVar63 = vcmpps_avx(auVar63,auVar94,1);
      auVar50 = vblendvps_avx(local_28e0,auVar94,auVar63);
      auVar63 = vandps_avx(local_28c0,local_2aa0);
      auVar63 = vcmpps_avx(auVar63,auVar94,1);
      auVar63 = vblendvps_avx(local_28c0,auVar94,auVar63);
      auVar62 = vrcpps_avx(auVar49);
      auVar95._8_4_ = 0x3f800000;
      auVar95._0_8_ = 0x3f8000003f800000;
      auVar95._12_4_ = 0x3f800000;
      auVar95._16_4_ = 0x3f800000;
      auVar95._20_4_ = 0x3f800000;
      auVar95._24_4_ = 0x3f800000;
      auVar95._28_4_ = 0x3f800000;
      auVar17 = vfnmadd213ps_fma(auVar49,auVar62,auVar95);
      auVar17 = vfmadd132ps_fma(ZEXT1632(auVar17),auVar62,auVar62);
      auVar49 = vrcpps_avx(auVar50);
      auVar18 = vfnmadd213ps_fma(auVar50,auVar49,auVar95);
      auVar18 = vfmadd132ps_fma(ZEXT1632(auVar18),auVar49,auVar49);
      auVar49 = vrcpps_avx(auVar63);
      auVar19 = vfnmadd213ps_fma(auVar63,auVar49,auVar95);
      auVar19 = vfmadd132ps_fma(ZEXT1632(auVar19),auVar49,auVar49);
      local_28a0 = ZEXT1632(auVar17);
      local_2880 = ZEXT1632(auVar18);
      local_2860 = ZEXT1632(auVar19);
      local_2840 = auVar17._0_4_ * (float)local_2960._0_4_;
      fStack_283c = auVar17._4_4_ * (float)local_2960._4_4_;
      fStack_2838 = auVar17._8_4_ * (float)local_2960._8_4_;
      fStack_2834 = auVar17._12_4_ * (float)local_2960._12_4_;
      fStack_2830 = (float)local_2960._16_4_ * 0.0;
      fStack_282c = (float)local_2960._20_4_ * 0.0;
      fStack_2828 = (float)local_2960._24_4_ * 0.0;
      local_2820 = (float)local_2960._32_4_ * auVar18._0_4_;
      fStack_281c = (float)local_2960._36_4_ * auVar18._4_4_;
      fStack_2818 = (float)local_2960._40_4_ * auVar18._8_4_;
      fStack_2814 = (float)local_2960._44_4_ * auVar18._12_4_;
      fStack_2810 = (float)local_2960._48_4_ * 0.0;
      fStack_280c = (float)local_2960._52_4_ * 0.0;
      fStack_2808 = (float)local_2960._56_4_ * 0.0;
      local_2800 = (float)local_2960._64_4_ * auVar19._0_4_;
      fStack_27fc = (float)local_2960._68_4_ * auVar19._4_4_;
      fStack_27f8 = (float)local_2960._72_4_ * auVar19._8_4_;
      fStack_27f4 = (float)local_2960._76_4_ * auVar19._12_4_;
      fStack_27f0 = (float)local_2960._80_4_ * 0.0;
      fStack_27ec = (float)local_2960._84_4_ * 0.0;
      fStack_27e8 = (float)local_2960._88_4_ * 0.0;
      auVar63 = vcmpps_avx(local_28a0,ZEXT1632(auVar48),1);
      auVar49._8_4_ = 0x10;
      auVar49._0_8_ = 0x1000000010;
      auVar49._12_4_ = 0x10;
      auVar49._16_4_ = 0x10;
      auVar49._20_4_ = 0x10;
      auVar49._24_4_ = 0x10;
      auVar49._28_4_ = 0x10;
      local_27e0 = vandps_avx(auVar63,auVar49);
      auVar50._8_4_ = 0x20;
      auVar50._0_8_ = 0x2000000020;
      auVar50._12_4_ = 0x20;
      auVar50._16_4_ = 0x20;
      auVar50._20_4_ = 0x20;
      auVar50._24_4_ = 0x20;
      auVar50._28_4_ = 0x20;
      auVar68._8_4_ = 0x30;
      auVar68._0_8_ = 0x3000000030;
      auVar68._12_4_ = 0x30;
      auVar68._16_4_ = 0x30;
      auVar68._20_4_ = 0x30;
      auVar68._24_4_ = 0x30;
      auVar68._28_4_ = 0x30;
      auVar49 = ZEXT1632(auVar48);
      auVar63 = vcmpps_avx(ZEXT1632(auVar18),auVar49,5);
      local_27c0 = vblendvps_avx(auVar68,auVar50,auVar63);
      auVar62._8_4_ = 0x40;
      auVar62._0_8_ = 0x4000000040;
      auVar62._12_4_ = 0x40;
      auVar62._16_4_ = 0x40;
      auVar62._20_4_ = 0x40;
      auVar62._24_4_ = 0x40;
      auVar62._28_4_ = 0x40;
      auVar69._8_4_ = 0x50;
      auVar69._0_8_ = 0x5000000050;
      auVar69._12_4_ = 0x50;
      auVar69._16_4_ = 0x50;
      auVar69._20_4_ = 0x50;
      auVar69._24_4_ = 0x50;
      auVar69._28_4_ = 0x50;
      auVar63 = vcmpps_avx(ZEXT1632(auVar19),auVar49,5);
      local_27a0 = vblendvps_avx(auVar69,auVar62,auVar63);
      auVar63 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x60),auVar49);
      auVar49 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x100),auVar49);
      local_2a80 = vpmovsxwd_avx2(auVar5);
      local_1e80._8_4_ = 0x7f800000;
      local_1e80._0_8_ = 0x7f8000007f800000;
      local_1e80._12_4_ = 0x7f800000;
      local_1e80._16_4_ = 0x7f800000;
      local_1e80._20_4_ = 0x7f800000;
      local_1e80._24_4_ = 0x7f800000;
      local_1e80._28_4_ = 0x7f800000;
      auVar103 = ZEXT3264(local_1e80);
      local_2780 = vblendvps_avx(local_1e80,auVar63,local_2a80);
      auVar63._8_4_ = 0xff800000;
      auVar63._0_8_ = 0xff800000ff800000;
      auVar63._12_4_ = 0xff800000;
      auVar63._16_4_ = 0xff800000;
      auVar63._20_4_ = 0xff800000;
      auVar63._24_4_ = 0xff800000;
      auVar63._28_4_ = 0xff800000;
      local_2760 = vblendvps_avx(auVar63,auVar49,local_2a80);
      auVar48 = vpcmpeqd_avx(local_2760._0_16_,local_2760._0_16_);
      local_2b40 = vpmovsxwd_avx2(auVar5 ^ auVar48);
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar31 = 5;
      }
      else {
        uVar31 = (ulong)((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                        RTC_RAY_QUERY_FLAG_INCOHERENT) * 3 + 2;
      }
      local_2c08 = ray + 0x100;
      puVar33 = local_2600;
      local_2610 = 0xfffffffffffffff8;
      pauVar30 = (undefined1 (*) [32])local_1e40;
      local_1e60 = local_2780;
      local_2b80 = mm_lookupmask_ps._16_8_;
      uStack_2b78 = mm_lookupmask_ps._24_8_;
      uStack_2b70 = mm_lookupmask_ps._16_8_;
      uStack_2b68 = mm_lookupmask_ps._24_8_;
      auVar63 = vpcmpeqd_avx2(local_2b40,local_2b40);
      auVar46 = ZEXT3264(auVar63);
      local_2c50 = uVar31;
      local_2c48 = context;
      local_2bc8 = This;
      uStack_2824 = local_2960._28_4_;
      uStack_2804 = local_2960._60_4_;
      uStack_27e4 = local_2960._92_4_;
LAB_019ce854:
      do {
        do {
          root.ptr = puVar33[-1];
          if (root.ptr == 0xfffffffffffffff8) goto LAB_019cf32f;
          puVar33 = puVar33 + -1;
          pauVar30 = pauVar30 + -1;
          local_2c00 = *pauVar30;
          auVar58 = ZEXT3264(local_2c00);
          auVar63 = vcmpps_avx(local_2c00,local_2760,1);
        } while ((((((((auVar63 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                      (auVar63 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     (auVar63 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    SUB321(auVar63 >> 0x7f,0) == '\0') &&
                   (auVar63 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  SUB321(auVar63 >> 0xbf,0) == '\0') &&
                 (auVar63 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 -1 < auVar63[0x1f]);
        uVar35 = vmovmskps_avx(auVar63);
        unaff_R15 = CONCAT44((int)(unaff_R15 >> 0x20),uVar35);
        if (uVar31 < CONCAT44(0,POPCOUNT(uVar35))) {
LAB_019ce892:
          do {
            auVar63 = auVar46._0_32_;
            uVar34 = (uint)root.ptr;
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_019cf32f;
              auVar49 = vcmpps_avx(local_2760,auVar58._0_32_,6);
              if ((((((((auVar49 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar49 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar49 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar49 >> 0x7f,0) == '\0') &&
                    (auVar49 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar49 >> 0xbf,0) == '\0') &&
                  (auVar49 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar49[0x1f]) goto LAB_019ce854;
              uVar28 = (ulong)(uVar34 & 0xf) - 8;
              auVar49 = local_2b40;
              if (uVar28 == 0) goto LAB_019cf20d;
              local_2980 = local_2b40;
              local_2c00 = local_2b40 ^ auVar63;
              lVar29 = (root.ptr & 0xfffffffffffffff0) + 0x130;
              uVar32 = 0;
              goto LAB_019ceb43;
            }
            uVar28 = root.ptr & 0xfffffffffffffff0;
            root.ptr = 8;
            lVar29 = -0x10;
            auVar63 = vcmpps_avx(local_2760,auVar58._0_32_,6);
            auVar49 = auVar103._0_32_;
            do {
              uVar32 = *(ulong *)(uVar28 + 0x20 + lVar29 * 2);
              if (uVar32 == 8) {
                auVar58 = ZEXT3264(auVar49);
                break;
              }
              uVar35 = *(undefined4 *)(uVar28 + 0x90 + lVar29);
              auVar70._4_4_ = uVar35;
              auVar70._0_4_ = uVar35;
              auVar70._8_4_ = uVar35;
              auVar70._12_4_ = uVar35;
              auVar70._16_4_ = uVar35;
              auVar70._20_4_ = uVar35;
              auVar70._24_4_ = uVar35;
              auVar70._28_4_ = uVar35;
              uVar35 = *(undefined4 *)(uVar28 + 0x30 + lVar29);
              auVar64._4_4_ = uVar35;
              auVar64._0_4_ = uVar35;
              auVar64._8_4_ = uVar35;
              auVar64._12_4_ = uVar35;
              auVar64._16_4_ = uVar35;
              auVar64._20_4_ = uVar35;
              auVar64._24_4_ = uVar35;
              auVar64._28_4_ = uVar35;
              auVar50 = *(undefined1 (*) [32])(ray + 0xe0);
              uVar35 = *(undefined4 *)(uVar28 + 0xb0 + lVar29);
              auVar73._4_4_ = uVar35;
              auVar73._0_4_ = uVar35;
              auVar73._8_4_ = uVar35;
              auVar73._12_4_ = uVar35;
              auVar73._16_4_ = uVar35;
              auVar73._20_4_ = uVar35;
              auVar73._24_4_ = uVar35;
              auVar73._28_4_ = uVar35;
              auVar48 = vfmadd231ps_fma(auVar64,auVar50,auVar70);
              uVar35 = *(undefined4 *)(uVar28 + 0x50 + lVar29);
              auVar71._4_4_ = uVar35;
              auVar71._0_4_ = uVar35;
              auVar71._8_4_ = uVar35;
              auVar71._12_4_ = uVar35;
              auVar71._16_4_ = uVar35;
              auVar71._20_4_ = uVar35;
              auVar71._24_4_ = uVar35;
              auVar71._28_4_ = uVar35;
              auVar5 = vfmadd231ps_fma(auVar71,auVar50,auVar73);
              uVar35 = *(undefined4 *)(uVar28 + 0xd0 + lVar29);
              auVar78._4_4_ = uVar35;
              auVar78._0_4_ = uVar35;
              auVar78._8_4_ = uVar35;
              auVar78._12_4_ = uVar35;
              auVar78._16_4_ = uVar35;
              auVar78._20_4_ = uVar35;
              auVar78._24_4_ = uVar35;
              auVar78._28_4_ = uVar35;
              uVar35 = *(undefined4 *)(uVar28 + 0x70 + lVar29);
              auVar74._4_4_ = uVar35;
              auVar74._0_4_ = uVar35;
              auVar74._8_4_ = uVar35;
              auVar74._12_4_ = uVar35;
              auVar74._16_4_ = uVar35;
              auVar74._20_4_ = uVar35;
              auVar74._24_4_ = uVar35;
              auVar74._28_4_ = uVar35;
              uVar35 = *(undefined4 *)(uVar28 + 0xa0 + lVar29);
              auVar86._4_4_ = uVar35;
              auVar86._0_4_ = uVar35;
              auVar86._8_4_ = uVar35;
              auVar86._12_4_ = uVar35;
              auVar86._16_4_ = uVar35;
              auVar86._20_4_ = uVar35;
              auVar86._24_4_ = uVar35;
              auVar86._28_4_ = uVar35;
              uVar35 = *(undefined4 *)(uVar28 + 0x40 + lVar29);
              auVar82._4_4_ = uVar35;
              auVar82._0_4_ = uVar35;
              auVar82._8_4_ = uVar35;
              auVar82._12_4_ = uVar35;
              auVar82._16_4_ = uVar35;
              auVar82._20_4_ = uVar35;
              auVar82._24_4_ = uVar35;
              auVar82._28_4_ = uVar35;
              auVar17 = vfmadd231ps_fma(auVar74,auVar50,auVar78);
              auVar18 = vfmadd231ps_fma(auVar82,auVar50,auVar86);
              uVar35 = *(undefined4 *)(uVar28 + 0xc0 + lVar29);
              auVar79._4_4_ = uVar35;
              auVar79._0_4_ = uVar35;
              auVar79._8_4_ = uVar35;
              auVar79._12_4_ = uVar35;
              auVar79._16_4_ = uVar35;
              auVar79._20_4_ = uVar35;
              auVar79._24_4_ = uVar35;
              auVar79._28_4_ = uVar35;
              uVar35 = *(undefined4 *)(uVar28 + 0x60 + lVar29);
              auVar87._4_4_ = uVar35;
              auVar87._0_4_ = uVar35;
              auVar87._8_4_ = uVar35;
              auVar87._12_4_ = uVar35;
              auVar87._16_4_ = uVar35;
              auVar87._20_4_ = uVar35;
              auVar87._24_4_ = uVar35;
              auVar87._28_4_ = uVar35;
              uVar35 = *(undefined4 *)(uVar28 + 0xe0 + lVar29);
              auVar92._4_4_ = uVar35;
              auVar92._0_4_ = uVar35;
              auVar92._8_4_ = uVar35;
              auVar92._12_4_ = uVar35;
              auVar92._16_4_ = uVar35;
              auVar92._20_4_ = uVar35;
              auVar92._24_4_ = uVar35;
              auVar92._28_4_ = uVar35;
              auVar19 = vfmadd231ps_fma(auVar87,auVar50,auVar79);
              uVar35 = *(undefined4 *)(uVar28 + 0x80 + lVar29);
              auVar96._4_4_ = uVar35;
              auVar96._0_4_ = uVar35;
              auVar96._8_4_ = uVar35;
              auVar96._12_4_ = uVar35;
              auVar96._16_4_ = uVar35;
              auVar96._20_4_ = uVar35;
              auVar96._24_4_ = uVar35;
              auVar96._28_4_ = uVar35;
              auVar13 = vfmadd231ps_fma(auVar96,auVar50,auVar92);
              auVar24._4_4_ = fStack_283c;
              auVar24._0_4_ = local_2840;
              auVar24._8_4_ = fStack_2838;
              auVar24._12_4_ = fStack_2834;
              auVar24._16_4_ = fStack_2830;
              auVar24._20_4_ = fStack_282c;
              auVar24._24_4_ = fStack_2828;
              auVar24._28_4_ = uStack_2824;
              auVar48 = vfmsub213ps_fma(ZEXT1632(auVar48),local_28a0,auVar24);
              auVar25._4_4_ = fStack_281c;
              auVar25._0_4_ = local_2820;
              auVar25._8_4_ = fStack_2818;
              auVar25._12_4_ = fStack_2814;
              auVar25._16_4_ = fStack_2810;
              auVar25._20_4_ = fStack_280c;
              auVar25._24_4_ = fStack_2808;
              auVar25._28_4_ = uStack_2804;
              auVar5 = vfmsub213ps_fma(ZEXT1632(auVar5),local_2880,auVar25);
              auVar26._4_4_ = fStack_27fc;
              auVar26._0_4_ = local_2800;
              auVar26._8_4_ = fStack_27f8;
              auVar26._12_4_ = fStack_27f4;
              auVar26._16_4_ = fStack_27f0;
              auVar26._20_4_ = fStack_27ec;
              auVar26._24_4_ = fStack_27e8;
              auVar26._28_4_ = uStack_27e4;
              auVar17 = vfmsub213ps_fma(ZEXT1632(auVar17),local_2860,auVar26);
              auVar18 = vfmsub213ps_fma(ZEXT1632(auVar18),local_28a0,auVar24);
              auVar19 = vfmsub213ps_fma(ZEXT1632(auVar19),local_2880,auVar25);
              auVar13 = vfmsub213ps_fma(ZEXT1632(auVar13),local_2860,auVar26);
              auVar62 = vpminsd_avx2(ZEXT1632(auVar48),ZEXT1632(auVar18));
              auVar68 = vpminsd_avx2(ZEXT1632(auVar5),ZEXT1632(auVar19));
              auVar62 = vpmaxsd_avx2(auVar62,auVar68);
              auVar68 = vpminsd_avx2(ZEXT1632(auVar17),ZEXT1632(auVar13));
              auVar68 = vpmaxsd_avx2(auVar62,auVar68);
              auVar62 = vpmaxsd_avx2(ZEXT1632(auVar48),ZEXT1632(auVar18));
              auVar69 = vpmaxsd_avx2(ZEXT1632(auVar5),ZEXT1632(auVar19));
              auVar69 = vpminsd_avx2(auVar62,auVar69);
              auVar62 = vpmaxsd_avx2(ZEXT1632(auVar17),ZEXT1632(auVar13));
              auVar69 = vpminsd_avx2(auVar69,auVar62);
              auVar62 = vpmaxsd_avx2(auVar68,local_2780);
              auVar69 = vpminsd_avx2(auVar69,local_2760);
              auVar62 = vcmpps_avx(auVar62,auVar69,2);
              if ((uVar34 & 7) == 6) {
                uVar35 = *(undefined4 *)(uVar28 + 0xf0 + lVar29);
                auVar72._4_4_ = uVar35;
                auVar72._0_4_ = uVar35;
                auVar72._8_4_ = uVar35;
                auVar72._12_4_ = uVar35;
                auVar72._16_4_ = uVar35;
                auVar72._20_4_ = uVar35;
                auVar72._24_4_ = uVar35;
                auVar72._28_4_ = uVar35;
                auVar69 = vcmpps_avx(auVar72,auVar50,2);
                uVar35 = *(undefined4 *)(uVar28 + 0x100 + lVar29);
                auVar75._4_4_ = uVar35;
                auVar75._0_4_ = uVar35;
                auVar75._8_4_ = uVar35;
                auVar75._12_4_ = uVar35;
                auVar75._16_4_ = uVar35;
                auVar75._20_4_ = uVar35;
                auVar75._24_4_ = uVar35;
                auVar75._28_4_ = uVar35;
                auVar50 = vcmpps_avx(auVar50,auVar75,1);
                auVar50 = vandps_avx(auVar69,auVar50);
                auVar50 = vandps_avx(auVar50,auVar62);
                auVar48 = vpackssdw_avx(auVar50._0_16_,auVar50._16_16_);
              }
              else {
                auVar48 = vpackssdw_avx(auVar62._0_16_,auVar62._16_16_);
              }
              auVar5 = vpackssdw_avx(auVar63._0_16_,auVar63._16_16_);
              auVar48 = vpand_avx(auVar48,auVar5);
              auVar50 = vpmovzxwd_avx2(auVar48);
              auVar50 = vpslld_avx2(auVar50,0x1f);
              if ((((((((auVar50 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar50 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar50 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar50 >> 0x7f,0) == '\0') &&
                    (auVar50 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar50 >> 0xbf,0) == '\0') &&
                  (auVar50 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar50[0x1f]) {
                auVar58 = ZEXT3264(auVar49);
                uVar32 = root.ptr;
              }
              else {
                auVar50 = vblendvps_avx(auVar103._0_32_,auVar68,auVar50);
                auVar58 = ZEXT3264(auVar50);
                if (root.ptr != 8) {
                  *puVar33 = root.ptr;
                  puVar33 = puVar33 + 1;
                  *pauVar30 = auVar49;
                  pauVar30 = pauVar30 + 1;
                }
              }
              root.ptr = uVar32;
              auVar49 = auVar58._0_32_;
              lVar29 = lVar29 + 4;
            } while (lVar29 != 0);
            iVar27 = 4;
            if (root.ptr == 8) {
              auVar63 = vpcmpeqd_avx2(auVar49,auVar49);
              auVar46 = ZEXT3264(auVar63);
              goto LAB_019cf1f2;
            }
            auVar63 = vcmpps_avx(local_2760,auVar58._0_32_,6);
            uVar35 = vmovmskps_avx(auVar63);
            auVar63 = vpcmpeqd_avx2(auVar49,auVar49);
            auVar46 = ZEXT3264(auVar63);
          } while ((byte)uVar31 < (byte)POPCOUNT(uVar35));
          *puVar33 = root.ptr;
          puVar33 = puVar33 + 1;
          *pauVar30 = auVar58._0_32_;
          pauVar30 = pauVar30 + 1;
        }
        else {
          local_2b60._0_8_ = CONCAT44(0,POPCOUNT(uVar35));
          while (unaff_R15 != 0) {
            k = 0;
            for (uVar31 = unaff_R15; (uVar31 & 1) == 0; uVar31 = uVar31 >> 1 | 0x8000000000000000) {
              k = k + 1;
            }
            local_2c40._0_8_ = k;
            auVar63 = ZEXT1632(auVar46._0_16_);
            bVar37 = occluded1(local_2bc8,local_2bd0,root,k,&local_2c51,ray,
                               (TravRayK<8,_false> *)&local_2960.field_0,context);
            if (bVar37) {
              *(undefined4 *)(local_2b40 + local_2c40._0_8_ * 4) = 0xffffffff;
            }
            unaff_R15 = unaff_R15 - 1 & unaff_R15;
            auVar63 = vpcmpeqd_avx2(auVar63,auVar63);
            auVar46 = ZEXT3264(auVar63);
            uVar31 = local_2c50;
            context = local_2c48;
          }
          auVar63 = auVar46._0_32_ & ~local_2b40;
          if ((((((((auVar63 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar63 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar63 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar63 >> 0x7f,0) == '\0') &&
                (auVar63 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar63 >> 0xbf,0) == '\0') &&
              (auVar63 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar63[0x1f]) {
            iVar27 = 3;
          }
          else {
            auVar57._8_4_ = 0xff800000;
            auVar57._0_8_ = 0xff800000ff800000;
            auVar57._12_4_ = 0xff800000;
            auVar57._16_4_ = 0xff800000;
            auVar57._20_4_ = 0xff800000;
            auVar57._24_4_ = 0xff800000;
            auVar57._28_4_ = 0xff800000;
            auVar63 = vblendvps_avx(local_2760,auVar57,local_2b40);
            auVar49 = vpcmpeqd_avx2(local_2760,local_2760);
            auVar46 = ZEXT3264(auVar49);
            iVar27 = 2;
            local_2760 = auVar63;
          }
          auVar103 = ZEXT3264(CONCAT428(0x7f800000,
                                        CONCAT424(0x7f800000,
                                                  CONCAT420(0x7f800000,
                                                            CONCAT416(0x7f800000,
                                                                      CONCAT412(0x7f800000,
                                                                                CONCAT48(0x7f800000,
                                                                                                                                                                                  
                                                  0x7f8000007f800000)))))));
          auVar58 = ZEXT3264(local_2c00);
          unaff_R15 = 0;
          if ((uint)uVar31 < (uint)local_2b60._0_4_) goto LAB_019ce892;
        }
LAB_019cf1f2:
      } while ((iVar27 == 4) || (iVar27 == 2));
LAB_019cf32f:
      auVar63 = vandps_avx(local_2a80,local_2b40);
      auVar45._8_4_ = 0xff800000;
      auVar45._0_8_ = 0xff800000ff800000;
      auVar45._12_4_ = 0xff800000;
      auVar45._16_4_ = 0xff800000;
      auVar45._20_4_ = 0xff800000;
      auVar45._24_4_ = 0xff800000;
      auVar45._28_4_ = 0xff800000;
      auVar63 = vmaskmovps_avx(auVar63,auVar45);
      *(undefined1 (*) [32])local_2c08 = auVar63;
    }
  }
  return;
  while( true ) {
    uVar32 = uVar32 + 1;
    lVar29 = lVar29 + 0x140;
    if (uVar28 <= uVar32) break;
LAB_019ceb43:
    auVar58 = ZEXT3264(local_2c00);
    uVar36 = 0;
    auVar49 = local_2c00;
    while( true ) {
      auVar50 = auVar58._0_32_;
      uVar34 = *(uint *)(lVar29 + -0x10 + uVar36 * 4);
      unaff_R15 = uVar36;
      if ((ulong)uVar34 == 0xffffffff) break;
      auVar63 = *(undefined1 (*) [32])(ray + 0x80);
      auVar50 = *(undefined1 (*) [32])(ray + 0xa0);
      auVar62 = *(undefined1 (*) [32])(ray + 0xe0);
      uVar35 = *(undefined4 *)(lVar29 + -0xa0 + uVar36 * 4);
      auVar41._4_4_ = uVar35;
      auVar41._0_4_ = uVar35;
      auVar41._8_4_ = uVar35;
      auVar41._12_4_ = uVar35;
      auVar41._16_4_ = uVar35;
      auVar41._20_4_ = uVar35;
      auVar41._24_4_ = uVar35;
      auVar41._28_4_ = uVar35;
      uVar35 = *(undefined4 *)(lVar29 + -0x90 + uVar36 * 4);
      auVar51._4_4_ = uVar35;
      auVar51._0_4_ = uVar35;
      auVar51._8_4_ = uVar35;
      auVar51._12_4_ = uVar35;
      auVar51._16_4_ = uVar35;
      auVar51._20_4_ = uVar35;
      auVar51._24_4_ = uVar35;
      auVar51._28_4_ = uVar35;
      uVar35 = *(undefined4 *)(lVar29 + -0x80 + uVar36 * 4);
      auVar83._4_4_ = uVar35;
      auVar83._0_4_ = uVar35;
      auVar83._8_4_ = uVar35;
      auVar83._12_4_ = uVar35;
      auVar83._16_4_ = uVar35;
      auVar83._20_4_ = uVar35;
      auVar83._24_4_ = uVar35;
      auVar83._28_4_ = uVar35;
      uVar35 = *(undefined4 *)(lVar29 + -0x130 + uVar36 * 4);
      auVar76._4_4_ = uVar35;
      auVar76._0_4_ = uVar35;
      auVar76._8_4_ = uVar35;
      auVar76._12_4_ = uVar35;
      auVar76._16_4_ = uVar35;
      auVar76._20_4_ = uVar35;
      auVar76._24_4_ = uVar35;
      auVar76._28_4_ = uVar35;
      uVar35 = *(undefined4 *)(lVar29 + -0x120 + uVar36 * 4);
      auVar80._4_4_ = uVar35;
      auVar80._0_4_ = uVar35;
      auVar80._8_4_ = uVar35;
      auVar80._12_4_ = uVar35;
      auVar80._16_4_ = uVar35;
      auVar80._20_4_ = uVar35;
      auVar80._24_4_ = uVar35;
      auVar80._28_4_ = uVar35;
      uVar35 = *(undefined4 *)(lVar29 + -0x110 + uVar36 * 4);
      auVar97._4_4_ = uVar35;
      auVar97._0_4_ = uVar35;
      auVar97._8_4_ = uVar35;
      auVar97._12_4_ = uVar35;
      auVar97._16_4_ = uVar35;
      auVar97._20_4_ = uVar35;
      auVar97._24_4_ = uVar35;
      auVar97._28_4_ = uVar35;
      auVar48 = vfmadd231ps_fma(auVar76,auVar62,auVar41);
      auVar5 = vfmadd231ps_fma(auVar80,auVar62,auVar51);
      uVar35 = *(undefined4 *)(lVar29 + -0x70 + uVar36 * 4);
      auVar42._4_4_ = uVar35;
      auVar42._0_4_ = uVar35;
      auVar42._8_4_ = uVar35;
      auVar42._12_4_ = uVar35;
      auVar42._16_4_ = uVar35;
      auVar42._20_4_ = uVar35;
      auVar42._24_4_ = uVar35;
      auVar42._28_4_ = uVar35;
      uVar35 = *(undefined4 *)(lVar29 + -0x60 + uVar36 * 4);
      auVar52._4_4_ = uVar35;
      auVar52._0_4_ = uVar35;
      auVar52._8_4_ = uVar35;
      auVar52._12_4_ = uVar35;
      auVar52._16_4_ = uVar35;
      auVar52._20_4_ = uVar35;
      auVar52._24_4_ = uVar35;
      auVar52._28_4_ = uVar35;
      uVar35 = *(undefined4 *)(lVar29 + -0x50 + uVar36 * 4);
      auVar88._4_4_ = uVar35;
      auVar88._0_4_ = uVar35;
      auVar88._8_4_ = uVar35;
      auVar88._12_4_ = uVar35;
      auVar88._16_4_ = uVar35;
      auVar88._20_4_ = uVar35;
      auVar88._24_4_ = uVar35;
      auVar88._28_4_ = uVar35;
      uVar35 = *(undefined4 *)(lVar29 + -0x100 + uVar36 * 4);
      auVar93._4_4_ = uVar35;
      auVar93._0_4_ = uVar35;
      auVar93._8_4_ = uVar35;
      auVar93._12_4_ = uVar35;
      auVar93._16_4_ = uVar35;
      auVar93._20_4_ = uVar35;
      auVar93._24_4_ = uVar35;
      auVar93._28_4_ = uVar35;
      uVar35 = *(undefined4 *)(lVar29 + -0xf0 + uVar36 * 4);
      auVar98._4_4_ = uVar35;
      auVar98._0_4_ = uVar35;
      auVar98._8_4_ = uVar35;
      auVar98._12_4_ = uVar35;
      auVar98._16_4_ = uVar35;
      auVar98._20_4_ = uVar35;
      auVar98._24_4_ = uVar35;
      auVar98._28_4_ = uVar35;
      uVar35 = *(undefined4 *)(lVar29 + -0xe0 + uVar36 * 4);
      auVar99._4_4_ = uVar35;
      auVar99._0_4_ = uVar35;
      auVar99._8_4_ = uVar35;
      auVar99._12_4_ = uVar35;
      auVar99._16_4_ = uVar35;
      auVar99._20_4_ = uVar35;
      auVar99._24_4_ = uVar35;
      auVar99._28_4_ = uVar35;
      auVar17 = vfmadd231ps_fma(auVar97,auVar62,auVar83);
      auVar18 = vfmadd231ps_fma(auVar93,auVar62,auVar42);
      auVar19 = vfmadd231ps_fma(auVar98,auVar62,auVar52);
      auVar13 = vfmadd231ps_fma(auVar99,auVar62,auVar88);
      uVar35 = *(undefined4 *)(lVar29 + -0x40 + uVar36 * 4);
      auVar43._4_4_ = uVar35;
      auVar43._0_4_ = uVar35;
      auVar43._8_4_ = uVar35;
      auVar43._12_4_ = uVar35;
      auVar43._16_4_ = uVar35;
      auVar43._20_4_ = uVar35;
      auVar43._24_4_ = uVar35;
      auVar43._28_4_ = uVar35;
      uVar1 = *(undefined4 *)(lVar29 + -0x30 + uVar36 * 4);
      auVar53._4_4_ = uVar1;
      auVar53._0_4_ = uVar1;
      auVar53._8_4_ = uVar1;
      auVar53._12_4_ = uVar1;
      auVar53._16_4_ = uVar1;
      auVar53._20_4_ = uVar1;
      auVar53._24_4_ = uVar1;
      auVar53._28_4_ = uVar1;
      uVar1 = *(undefined4 *)(lVar29 + -0x20 + uVar36 * 4);
      auVar84._4_4_ = uVar1;
      auVar84._0_4_ = uVar1;
      auVar84._8_4_ = uVar1;
      auVar84._12_4_ = uVar1;
      auVar84._16_4_ = uVar1;
      auVar84._20_4_ = uVar1;
      auVar84._24_4_ = uVar1;
      auVar84._28_4_ = uVar1;
      uVar2 = *(undefined4 *)(lVar29 + -0xd0 + uVar36 * 4);
      auVar101._4_4_ = uVar2;
      auVar101._0_4_ = uVar2;
      auVar101._8_4_ = uVar2;
      auVar101._12_4_ = uVar2;
      auVar101._16_4_ = uVar2;
      auVar101._20_4_ = uVar2;
      auVar101._24_4_ = uVar2;
      auVar101._28_4_ = uVar2;
      uVar2 = *(undefined4 *)(lVar29 + -0xc0 + uVar36 * 4);
      auVar102._4_4_ = uVar2;
      auVar102._0_4_ = uVar2;
      auVar102._8_4_ = uVar2;
      auVar102._12_4_ = uVar2;
      auVar102._16_4_ = uVar2;
      auVar102._20_4_ = uVar2;
      auVar102._24_4_ = uVar2;
      auVar102._28_4_ = uVar2;
      uVar2 = *(undefined4 *)(lVar29 + -0xb0 + uVar36 * 4);
      auVar89._4_4_ = uVar2;
      auVar89._0_4_ = uVar2;
      auVar89._8_4_ = uVar2;
      auVar89._12_4_ = uVar2;
      auVar89._16_4_ = uVar2;
      auVar89._20_4_ = uVar2;
      auVar89._24_4_ = uVar2;
      auVar89._28_4_ = uVar2;
      auVar68 = *(undefined1 (*) [32])(ray + 0xc0);
      auVar14 = vfmadd231ps_fma(auVar101,auVar62,auVar43);
      auVar15 = vfmadd231ps_fma(auVar102,auVar62,auVar53);
      auVar16 = vfmadd231ps_fma(auVar89,auVar62,auVar84);
      local_2b60 = vsubps_avx(ZEXT1632(auVar48),ZEXT1632(auVar18));
      auVar62 = vsubps_avx(ZEXT1632(auVar5),ZEXT1632(auVar19));
      auVar69 = vsubps_avx(ZEXT1632(auVar17),ZEXT1632(auVar13));
      auVar94 = vsubps_avx(ZEXT1632(auVar14),ZEXT1632(auVar48));
      auVar95 = vsubps_avx(ZEXT1632(auVar15),ZEXT1632(auVar5));
      auVar57 = vsubps_avx(ZEXT1632(auVar16),ZEXT1632(auVar17));
      auVar90._0_4_ = auVar62._0_4_ * auVar57._0_4_;
      auVar90._4_4_ = auVar62._4_4_ * auVar57._4_4_;
      auVar90._8_4_ = auVar62._8_4_ * auVar57._8_4_;
      auVar90._12_4_ = auVar62._12_4_ * auVar57._12_4_;
      auVar90._16_4_ = auVar62._16_4_ * auVar57._16_4_;
      auVar90._20_4_ = auVar62._20_4_ * auVar57._20_4_;
      auVar90._24_4_ = auVar62._24_4_ * auVar57._24_4_;
      auVar90._28_4_ = 0;
      auVar18 = vfmsub231ps_fma(auVar90,auVar95,auVar69);
      auVar6._4_4_ = auVar69._4_4_ * auVar94._4_4_;
      auVar6._0_4_ = auVar69._0_4_ * auVar94._0_4_;
      auVar6._8_4_ = auVar69._8_4_ * auVar94._8_4_;
      auVar6._12_4_ = auVar69._12_4_ * auVar94._12_4_;
      auVar6._16_4_ = auVar69._16_4_ * auVar94._16_4_;
      auVar6._20_4_ = auVar69._20_4_ * auVar94._20_4_;
      auVar6._24_4_ = auVar69._24_4_ * auVar94._24_4_;
      auVar6._28_4_ = uVar1;
      auVar19 = vfmsub231ps_fma(auVar6,auVar57,local_2b60);
      auVar7._4_4_ = auVar95._4_4_ * local_2b60._4_4_;
      auVar7._0_4_ = auVar95._0_4_ * local_2b60._0_4_;
      auVar7._8_4_ = auVar95._8_4_ * local_2b60._8_4_;
      auVar7._12_4_ = auVar95._12_4_ * local_2b60._12_4_;
      auVar7._16_4_ = auVar95._16_4_ * local_2b60._16_4_;
      auVar7._20_4_ = auVar95._20_4_ * local_2b60._20_4_;
      auVar7._24_4_ = auVar95._24_4_ * local_2b60._24_4_;
      auVar7._28_4_ = uVar35;
      auVar13 = vfmsub231ps_fma(auVar7,auVar94,auVar62);
      auVar44 = ZEXT1632(auVar13);
      auVar6 = vsubps_avx(ZEXT1632(auVar48),*(undefined1 (*) [32])ray);
      auVar7 = vsubps_avx(ZEXT1632(auVar5),*(undefined1 (*) [32])(ray + 0x20));
      auVar41 = vsubps_avx(ZEXT1632(auVar17),*(undefined1 (*) [32])(ray + 0x40));
      auVar85._4_4_ = auVar63._4_4_ * auVar7._4_4_;
      auVar85._0_4_ = auVar63._0_4_ * auVar7._0_4_;
      auVar85._8_4_ = auVar63._8_4_ * auVar7._8_4_;
      auVar85._12_4_ = auVar63._12_4_ * auVar7._12_4_;
      auVar85._16_4_ = auVar63._16_4_ * auVar7._16_4_;
      auVar85._20_4_ = auVar63._20_4_ * auVar7._20_4_;
      auVar85._24_4_ = auVar63._24_4_ * auVar7._24_4_;
      auVar85._28_4_ = local_2b60._28_4_;
      auVar17 = vfmsub231ps_fma(auVar85,auVar6,auVar50);
      auVar81._0_4_ = auVar68._0_4_ * auVar13._0_4_;
      auVar81._4_4_ = auVar68._4_4_ * auVar13._4_4_;
      auVar81._8_4_ = auVar68._8_4_ * auVar13._8_4_;
      auVar81._12_4_ = auVar68._12_4_ * auVar13._12_4_;
      auVar81._16_4_ = auVar68._16_4_ * 0.0;
      auVar81._20_4_ = auVar68._20_4_ * 0.0;
      auVar81._24_4_ = auVar68._24_4_ * 0.0;
      auVar81._28_4_ = 0;
      auVar85 = ZEXT1632(auVar19);
      auVar48 = vfmadd231ps_fma(auVar81,auVar85,auVar50);
      auVar91._4_4_ = auVar41._4_4_ * auVar50._4_4_;
      auVar91._0_4_ = auVar41._0_4_ * auVar50._0_4_;
      auVar91._8_4_ = auVar41._8_4_ * auVar50._8_4_;
      auVar91._12_4_ = auVar41._12_4_ * auVar50._12_4_;
      auVar91._16_4_ = auVar41._16_4_ * auVar50._16_4_;
      auVar91._20_4_ = auVar41._20_4_ * auVar50._20_4_;
      auVar91._24_4_ = auVar41._24_4_ * auVar50._24_4_;
      auVar91._28_4_ = auVar50._28_4_;
      auVar14 = vfmsub231ps_fma(auVar91,auVar7,auVar68);
      auVar20._4_4_ = auVar68._4_4_ * auVar6._4_4_;
      auVar20._0_4_ = auVar68._0_4_ * auVar6._0_4_;
      auVar20._8_4_ = auVar68._8_4_ * auVar6._8_4_;
      auVar20._12_4_ = auVar68._12_4_ * auVar6._12_4_;
      auVar20._16_4_ = auVar68._16_4_ * auVar6._16_4_;
      auVar20._20_4_ = auVar68._20_4_ * auVar6._20_4_;
      auVar20._24_4_ = auVar68._24_4_ * auVar6._24_4_;
      auVar20._28_4_ = auVar68._28_4_;
      auVar15 = vfmsub231ps_fma(auVar20,auVar41,auVar63);
      auVar91 = ZEXT1632(auVar18);
      auVar48 = vfmadd231ps_fma(ZEXT1632(auVar48),auVar91,auVar63);
      auVar21._4_4_ = auVar57._4_4_ * auVar17._4_4_;
      auVar21._0_4_ = auVar57._0_4_ * auVar17._0_4_;
      auVar21._8_4_ = auVar57._8_4_ * auVar17._8_4_;
      auVar21._12_4_ = auVar57._12_4_ * auVar17._12_4_;
      auVar21._16_4_ = auVar57._16_4_ * 0.0;
      auVar21._20_4_ = auVar57._20_4_ * 0.0;
      auVar21._24_4_ = auVar57._24_4_ * 0.0;
      auVar21._28_4_ = auVar57._28_4_;
      auVar5 = vfmadd231ps_fma(auVar21,ZEXT1632(auVar15),auVar95);
      auVar65._8_4_ = 0x80000000;
      auVar65._0_8_ = 0x8000000080000000;
      auVar65._12_4_ = 0x80000000;
      auVar65._16_4_ = 0x80000000;
      auVar65._20_4_ = 0x80000000;
      auVar65._24_4_ = 0x80000000;
      auVar65._28_4_ = 0x80000000;
      auVar63 = vandps_avx(ZEXT1632(auVar48),auVar65);
      auVar5 = vfmadd231ps_fma(ZEXT1632(auVar5),ZEXT1632(auVar14),auVar94);
      uVar8 = auVar63._0_4_;
      auVar100._0_4_ = auVar5._0_4_ ^ uVar8;
      uVar9 = auVar63._4_4_;
      auVar100._4_4_ = auVar5._4_4_ ^ uVar9;
      uVar10 = auVar63._8_4_;
      auVar100._8_4_ = auVar5._8_4_ ^ uVar10;
      uVar11 = auVar63._12_4_;
      auVar100._12_4_ = auVar5._12_4_ ^ uVar11;
      uVar35 = auVar63._16_4_;
      auVar100._16_4_ = uVar35;
      uVar1 = auVar63._20_4_;
      auVar100._20_4_ = uVar1;
      uVar2 = auVar63._24_4_;
      auVar100._24_4_ = uVar2;
      uVar12 = auVar63._28_4_;
      auVar100._28_4_ = uVar12;
      auVar63 = vcmpps_avx(auVar100,_DAT_01faff00,5);
      auVar50 = auVar49 & auVar63;
      auVar68 = ZEXT1632(auVar48);
      if ((((((((auVar50 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar50 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar50 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar50 >> 0x7f,0) == '\0') &&
            (auVar50 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar50 >> 0xbf,0) == '\0') &&
          (auVar50 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar50[0x1f])
      {
        auVar66._8_8_ = uStack_2b78;
        auVar66._0_8_ = local_2b80;
        auVar66._16_8_ = uStack_2b70;
        auVar66._24_8_ = uStack_2b68;
        auVar103 = ZEXT3264(CONCAT428(0x7f800000,
                                      CONCAT424(0x7f800000,
                                                CONCAT420(0x7f800000,
                                                          CONCAT416(0x7f800000,
                                                                    CONCAT412(0x7f800000,
                                                                              CONCAT48(0x7f800000,
                                                                                                                                                                              
                                                  0x7f8000007f800000)))))));
      }
      else {
        auVar63 = vandps_avx(auVar63,auVar49);
        auVar39._0_4_ = auVar69._0_4_ * auVar17._0_4_;
        auVar39._4_4_ = auVar69._4_4_ * auVar17._4_4_;
        auVar39._8_4_ = auVar69._8_4_ * auVar17._8_4_;
        auVar39._12_4_ = auVar69._12_4_ * auVar17._12_4_;
        auVar39._16_4_ = auVar69._16_4_ * 0.0;
        auVar39._20_4_ = auVar69._20_4_ * 0.0;
        auVar39._24_4_ = auVar69._24_4_ * 0.0;
        auVar39._28_4_ = 0;
        auVar5 = vfmadd213ps_fma(ZEXT1632(auVar15),auVar62,auVar39);
        auVar5 = vfmadd132ps_fma(ZEXT1632(auVar14),ZEXT1632(auVar5),local_2b60);
        auVar44._0_4_ = uVar8 ^ auVar5._0_4_;
        auVar44._4_4_ = uVar9 ^ auVar5._4_4_;
        auVar44._8_4_ = uVar10 ^ auVar5._8_4_;
        auVar44._12_4_ = uVar11 ^ auVar5._12_4_;
        auVar44._16_4_ = uVar35;
        auVar44._20_4_ = uVar1;
        auVar44._24_4_ = uVar2;
        auVar44._28_4_ = uVar12;
        auVar50 = vcmpps_avx(auVar44,_DAT_01faff00,5);
        auVar62 = auVar63 & auVar50;
        auVar103 = ZEXT3264(CONCAT428(0x7f800000,
                                      CONCAT424(0x7f800000,
                                                CONCAT420(0x7f800000,
                                                          CONCAT416(0x7f800000,
                                                                    CONCAT412(0x7f800000,
                                                                              CONCAT48(0x7f800000,
                                                                                                                                                                              
                                                  0x7f8000007f800000)))))));
        local_2bc0 = auVar85;
        local_2ba0 = auVar91;
        local_2ae0 = ZEXT1632(auVar13);
        if ((((((((auVar62 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar62 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar62 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar62 >> 0x7f,0) != '\0') ||
              (auVar62 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar62 >> 0xbf,0) != '\0') ||
            (auVar62 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar62[0x1f] < '\0') {
          auVar62 = vandps_avx(ZEXT1632(auVar48),local_2aa0);
          auVar63 = vandps_avx(auVar63,auVar50);
          auVar50 = vsubps_avx(auVar62,auVar100);
          auVar50 = vcmpps_avx(auVar50,auVar44,5);
          auVar69 = auVar63 & auVar50;
          if ((((((((auVar69 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar69 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar69 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar69 >> 0x7f,0) != '\0') ||
                (auVar69 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar69 >> 0xbf,0) != '\0') ||
              (auVar69 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar69[0x1f] < '\0') {
            auVar50 = vandps_avx(auVar50,auVar63);
            auVar22._4_4_ = auVar41._4_4_ * auVar13._4_4_;
            auVar22._0_4_ = auVar41._0_4_ * auVar13._0_4_;
            auVar22._8_4_ = auVar41._8_4_ * auVar13._8_4_;
            auVar22._12_4_ = auVar41._12_4_ * auVar13._12_4_;
            auVar22._16_4_ = auVar41._16_4_ * 0.0;
            auVar22._20_4_ = auVar41._20_4_ * 0.0;
            auVar22._24_4_ = auVar41._24_4_ * 0.0;
            auVar22._28_4_ = auVar63._28_4_;
            auVar48 = vfmadd132ps_fma(auVar7,auVar22,auVar85);
            auVar48 = vfmadd132ps_fma(auVar6,ZEXT1632(auVar48),auVar91);
            auVar40._0_4_ = uVar8 ^ auVar48._0_4_;
            auVar40._4_4_ = uVar9 ^ auVar48._4_4_;
            auVar40._8_4_ = uVar10 ^ auVar48._8_4_;
            auVar40._12_4_ = uVar11 ^ auVar48._12_4_;
            auVar40._16_4_ = uVar35;
            auVar40._20_4_ = uVar1;
            auVar40._24_4_ = uVar2;
            auVar40._28_4_ = uVar12;
            auVar23._4_4_ = auVar62._4_4_ * *(float *)(ray + 100);
            auVar23._0_4_ = auVar62._0_4_ * *(float *)(ray + 0x60);
            auVar23._8_4_ = auVar62._8_4_ * *(float *)(ray + 0x68);
            auVar23._12_4_ = auVar62._12_4_ * *(float *)(ray + 0x6c);
            auVar23._16_4_ = auVar62._16_4_ * *(float *)(ray + 0x70);
            auVar23._20_4_ = auVar62._20_4_ * *(float *)(ray + 0x74);
            auVar23._24_4_ = auVar62._24_4_ * *(float *)(ray + 0x78);
            auVar23._28_4_ = uVar12;
            auVar77._0_4_ = auVar62._0_4_ * *(float *)(ray + 0x100);
            auVar77._4_4_ = auVar62._4_4_ * *(float *)(ray + 0x104);
            auVar77._8_4_ = auVar62._8_4_ * *(float *)(ray + 0x108);
            auVar77._12_4_ = auVar62._12_4_ * *(float *)(ray + 0x10c);
            auVar77._16_4_ = auVar62._16_4_ * *(float *)(ray + 0x110);
            auVar77._20_4_ = auVar62._20_4_ * *(float *)(ray + 0x114);
            auVar77._24_4_ = auVar62._24_4_ * *(float *)(ray + 0x118);
            auVar77._28_4_ = 0;
            auVar63 = vcmpps_avx(auVar23,auVar40,1);
            auVar69 = vcmpps_avx(auVar40,auVar77,2);
            auVar63 = vandps_avx(auVar69,auVar63);
            auVar69 = auVar50 & auVar63;
            if ((((((((auVar69 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar69 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar69 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar69 >> 0x7f,0) == '\0') &&
                  (auVar69 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar69 >> 0xbf,0) == '\0') &&
                (auVar69 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar69[0x1f]) {
LAB_019cf1b2:
              auVar66._8_8_ = uStack_2b78;
              auVar66._0_8_ = local_2b80;
              auVar66._16_8_ = uStack_2b70;
              auVar66._24_8_ = uStack_2b68;
            }
            else {
              auVar63 = vandps_avx(auVar63,auVar50);
              auVar50 = vcmpps_avx(auVar68,_DAT_01faff00,4);
              auVar69 = auVar63 & auVar50;
              if ((((((((auVar69 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar69 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar69 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar69 >> 0x7f,0) == '\0') &&
                    (auVar69 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar69 >> 0xbf,0) == '\0') &&
                  (auVar69 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar69[0x1f]) goto LAB_019cf1b2;
              auVar66 = vandps_avx(auVar50,auVar63);
              local_2ba0._0_8_ = auVar18._0_8_;
              local_2ba0._8_8_ = auVar18._8_8_;
              local_2a20 = local_2ba0._0_8_;
              uStack_2a18 = local_2ba0._8_8_;
              uStack_2a10 = 0;
              uStack_2a08 = 0;
              local_2bc0._0_8_ = auVar19._0_8_;
              local_2bc0._8_8_ = auVar19._8_8_;
              local_2a40 = local_2bc0._0_8_;
              uStack_2a38 = local_2bc0._8_8_;
              uStack_2a30 = 0;
              uStack_2a28 = 0;
              local_2ae0._0_8_ = auVar13._0_8_;
              local_2ae0._8_8_ = auVar13._8_8_;
              local_2a60 = local_2ae0._0_8_;
              uStack_2a58 = local_2ae0._8_8_;
              uStack_2a50 = 0;
              uStack_2a48 = 0;
              local_2a00 = auVar62;
              _local_29e0 = auVar40;
              _local_29c0 = auVar44;
              _local_29a0 = auVar100;
            }
            auVar103 = ZEXT3264(CONCAT428(0x7f800000,
                                          CONCAT424(0x7f800000,
                                                    CONCAT420(0x7f800000,
                                                              CONCAT416(0x7f800000,
                                                                        CONCAT412(0x7f800000,
                                                                                  CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
            uVar31 = local_2c50;
            context = local_2c48;
            goto LAB_019ced17;
          }
        }
        auVar66._8_8_ = uStack_2b78;
        auVar66._0_8_ = local_2b80;
        auVar66._16_8_ = uStack_2b70;
        auVar66._24_8_ = uStack_2b68;
      }
LAB_019ced17:
      pGVar3 = (context->scene->geometries).items[uVar34].ptr;
      uVar8 = pGVar3->mask;
      auVar38._4_4_ = uVar8;
      auVar38._0_4_ = uVar8;
      auVar38._8_4_ = uVar8;
      auVar38._12_4_ = uVar8;
      auVar38._16_4_ = uVar8;
      auVar38._20_4_ = uVar8;
      auVar38._24_4_ = uVar8;
      auVar38._28_4_ = uVar8;
      auVar63 = vpand_avx2(auVar38,*(undefined1 (*) [32])(ray + 0x120));
      auVar50 = vpcmpeqd_avx2(auVar63,_DAT_01faff00);
      auVar63 = auVar66 & ~auVar50;
      auVar62 = vpcmpeqd_avx2(auVar44,auVar44);
      auVar46 = ZEXT3264(auVar62);
      local_2c40._0_32_ = auVar49;
      if ((((((((auVar63 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar63 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar63 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar63 >> 0x7f,0) == '\0') &&
            (auVar63 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar63 >> 0xbf,0) == '\0') &&
          (auVar63 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar63[0x1f])
      {
        auVar58 = ZEXT3264(local_2c00);
      }
      else {
        uVar35 = *(undefined4 *)(lVar29 + uVar36 * 4);
        auVar63 = vandnps_avx(auVar50,auVar66);
        if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
           (pGVar3->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
          auVar58 = ZEXT3264(local_2c00);
        }
        else {
          vpcmpeqd_avx2(auVar68,auVar68);
          auVar49 = vrcpps_avx(local_2a00);
          auVar67._8_4_ = 0x3f800000;
          auVar67._0_8_ = 0x3f8000003f800000;
          auVar67._12_4_ = 0x3f800000;
          auVar67._16_4_ = 0x3f800000;
          auVar67._20_4_ = 0x3f800000;
          auVar67._24_4_ = 0x3f800000;
          auVar67._28_4_ = 0x3f800000;
          auVar48 = vfnmadd213ps_fma(auVar49,local_2a00,auVar67);
          auVar48 = vfmadd132ps_fma(ZEXT1632(auVar48),auVar49,auVar49);
          fVar47 = auVar48._0_4_;
          local_26e0 = fVar47 * (float)local_29a0._0_4_;
          fVar59 = auVar48._4_4_;
          fStack_26dc = fVar59 * (float)local_29a0._4_4_;
          fVar60 = auVar48._8_4_;
          fStack_26d8 = fVar60 * fStack_2998;
          fVar61 = auVar48._12_4_;
          fStack_26d4 = fVar61 * fStack_2994;
          fStack_26d0 = fStack_2990 * 0.0;
          fStack_26cc = fStack_298c * 0.0;
          uStack_26c4 = auVar49._28_4_;
          fStack_26c8 = fStack_2988 * 0.0;
          local_26c0 = fVar47 * (float)local_29c0._0_4_;
          fStack_26bc = fVar59 * (float)local_29c0._4_4_;
          fStack_26b8 = fVar60 * fStack_29b8;
          fStack_26b4 = fVar61 * fStack_29b4;
          fStack_26b0 = fStack_29b0 * 0.0;
          fStack_26ac = fStack_29ac * 0.0;
          fStack_26a8 = fStack_29a8 * 0.0;
          local_2680._4_4_ = uVar34;
          local_2680._0_4_ = uVar34;
          local_2680._8_4_ = uVar34;
          local_2680._12_4_ = uVar34;
          local_2680._16_4_ = uVar34;
          local_2680._20_4_ = uVar34;
          local_2680._24_4_ = uVar34;
          local_2680._28_4_ = uVar34;
          local_26a0._4_4_ = uVar35;
          local_26a0._0_4_ = uVar35;
          local_26a0._8_4_ = uVar35;
          local_26a0._12_4_ = uVar35;
          local_26a0._16_4_ = uVar35;
          local_26a0._20_4_ = uVar35;
          local_26a0._24_4_ = uVar35;
          local_26a0._28_4_ = uVar35;
          local_2740 = local_2a20;
          uStack_2738 = uStack_2a18;
          uStack_2730 = uStack_2a10;
          uStack_2728 = uStack_2a08;
          local_2720 = local_2a40;
          uStack_2718 = uStack_2a38;
          uStack_2710 = uStack_2a30;
          uStack_2708 = uStack_2a28;
          local_2700._8_8_ = uStack_2a58;
          local_2700._0_8_ = local_2a60;
          local_2700._16_8_ = uStack_2a50;
          local_2700._24_8_ = uStack_2a48;
          uStack_26a4 = 0x3f800000;
          local_2660._4_4_ = context->user->instID[0];
          auVar48._0_4_ = fVar47 * (float)local_29e0._0_4_;
          auVar48._4_4_ = fVar59 * (float)local_29e0._4_4_;
          auVar48._8_4_ = fVar60 * fStack_29d8;
          auVar48._12_4_ = fVar61 * fStack_29d4;
          auVar54._16_4_ = fStack_29d0 * 0.0;
          auVar54._0_16_ = auVar48;
          auVar54._20_4_ = fStack_29cc * 0.0;
          auVar54._24_4_ = fStack_29c8 * 0.0;
          auVar54._28_4_ = 0;
          local_2660._0_4_ = local_2660._4_4_;
          local_2660._8_4_ = local_2660._4_4_;
          local_2660._12_4_ = local_2660._4_4_;
          local_2660._16_4_ = local_2660._4_4_;
          local_2660._20_4_ = local_2660._4_4_;
          local_2660._24_4_ = local_2660._4_4_;
          local_2660._28_4_ = local_2660._4_4_;
          local_2640._4_4_ = context->user->instPrimID[0];
          local_2640._0_4_ = local_2640._4_4_;
          local_2640._8_4_ = local_2640._4_4_;
          local_2640._12_4_ = local_2640._4_4_;
          local_2640._16_4_ = local_2640._4_4_;
          local_2640._20_4_ = local_2640._4_4_;
          local_2640._24_4_ = local_2640._4_4_;
          local_2640._28_4_ = local_2640._4_4_;
          local_2b60 = *(undefined1 (*) [32])(ray + 0x100);
          auVar49 = vblendvps_avx(local_2b60,auVar54,auVar63);
          *(undefined1 (*) [32])(ray + 0x100) = auVar49;
          local_2b10.valid = (int *)local_2ac0;
          local_2b10.geometryUserPtr = pGVar3->userPtr;
          local_2b10.context = context->user;
          local_2b10.hit = (RTCHitN *)&local_2740;
          local_2b10.N = 8;
          local_2ae0._0_8_ = pGVar3;
          local_2b10.ray = (RTCRayN *)ray;
          local_2ac0 = auVar63;
          if (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0) {
            local_2ba0._0_8_ = uVar28;
            local_2bc0._0_8_ = uVar32;
            auVar54 = ZEXT1632(auVar48);
            (*pGVar3->occlusionFilterN)(&local_2b10);
            auVar103 = ZEXT3264(CONCAT428(0x7f800000,
                                          CONCAT424(0x7f800000,
                                                    CONCAT420(0x7f800000,
                                                              CONCAT416(0x7f800000,
                                                                        CONCAT412(0x7f800000,
                                                                                  CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
            uVar28 = local_2ba0._0_8_;
            uVar31 = local_2c50;
            uVar32 = local_2bc0._0_8_;
            context = local_2c48;
          }
          auVar58 = ZEXT3264(local_2c00);
          auVar63 = vpcmpeqd_avx2(local_2ac0,_DAT_01faff00);
          auVar50 = vpcmpeqd_avx2(auVar54,auVar54);
          auVar49 = auVar50 & ~auVar63;
          if ((((((((auVar49 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar49 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar49 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar49 >> 0x7f,0) == '\0') &&
                (auVar49 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar49 >> 0xbf,0) == '\0') &&
              (auVar49 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar49[0x1f]) {
            auVar63 = auVar63 ^ auVar50;
          }
          else {
            p_Var4 = context->args->filter;
            if ((p_Var4 != (RTCFilterFunctionN)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || ((*(byte *)(local_2ae0._0_8_ + 0x3e) & 0x40) != 0)
                ))) {
              local_2ba0._0_8_ = uVar28;
              local_2bc0._0_8_ = uVar32;
              (*p_Var4)(&local_2b10);
              auVar58 = ZEXT3264(local_2c00);
              auVar103 = ZEXT3264(CONCAT428(0x7f800000,
                                            CONCAT424(0x7f800000,
                                                      CONCAT420(0x7f800000,
                                                                CONCAT416(0x7f800000,
                                                                          CONCAT412(0x7f800000,
                                                                                    CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
              uVar28 = local_2ba0._0_8_;
              uVar31 = local_2c50;
              uVar32 = local_2bc0._0_8_;
              context = local_2c48;
            }
            auVar49 = vpcmpeqd_avx2(local_2ac0,_DAT_01faff00);
            auVar63 = auVar49 ^ _DAT_01fe9960;
            auVar55._8_4_ = 0xff800000;
            auVar55._0_8_ = 0xff800000ff800000;
            auVar55._12_4_ = 0xff800000;
            auVar55._16_4_ = 0xff800000;
            auVar55._20_4_ = 0xff800000;
            auVar55._24_4_ = 0xff800000;
            auVar55._28_4_ = 0xff800000;
            auVar49 = vblendvps_avx(auVar55,*(undefined1 (*) [32])(local_2b10.ray + 0x100),auVar49);
            *(undefined1 (*) [32])(local_2b10.ray + 0x100) = auVar49;
          }
          auVar49 = vblendvps_avx(local_2b60,*(undefined1 (*) [32])local_2c08,auVar63);
          *(undefined1 (*) [32])local_2c08 = auVar49;
          auVar49 = vpcmpeqd_avx2(auVar49,auVar49);
          auVar46 = ZEXT3264(auVar49);
        }
        auVar49 = vandnps_avx(auVar63,local_2c40._0_32_);
      }
      auVar50 = auVar58._0_32_;
      if (((((((((auVar49 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                (auVar49 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               (auVar49 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              SUB321(auVar49 >> 0x7f,0) == '\0') &&
             (auVar49 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            SUB321(auVar49 >> 0xbf,0) == '\0') &&
           (auVar49 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar49[0x1f]
          ) || (unaff_R15 = uVar36 + 1, bVar37 = 2 < uVar36, uVar36 = unaff_R15, bVar37)) break;
    }
    auVar63 = auVar46._0_32_;
    local_2c00 = vandps_avx(auVar49,auVar50);
    auVar50 = auVar50 & auVar49;
    if ((((((((auVar50 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar50 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar50 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar50 >> 0x7f,0) == '\0') &&
          (auVar50 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar50 >> 0xbf,0) == '\0') &&
        (auVar50 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar50[0x1f])
    break;
  }
  local_2b40._0_4_ = local_2c00._0_4_ ^ auVar46._0_4_;
  local_2b40._4_4_ = local_2c00._4_4_ ^ auVar46._4_4_;
  local_2b40._8_4_ = local_2c00._8_4_ ^ auVar46._8_4_;
  local_2b40._12_4_ = local_2c00._12_4_ ^ auVar46._12_4_;
  local_2b40._16_4_ = local_2c00._16_4_ ^ auVar46._16_4_;
  local_2b40._20_4_ = local_2c00._20_4_ ^ auVar46._20_4_;
  local_2b40._24_4_ = local_2c00._24_4_ ^ auVar46._24_4_;
  local_2b40._28_4_ = local_2c00._28_4_ ^ auVar46._28_4_;
  auVar49 = local_2980;
LAB_019cf20d:
  local_2b40 = vpor_avx2(auVar49,local_2b40);
  auVar63 = auVar63 & ~local_2b40;
  if ((((((((auVar63 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
           (auVar63 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
          (auVar63 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
         SUB321(auVar63 >> 0x7f,0) == '\0') &&
        (auVar63 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
       SUB321(auVar63 >> 0xbf,0) == '\0') &&
      (auVar63 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar63[0x1f])
  goto LAB_019cf32f;
  auVar56._8_4_ = 0xff800000;
  auVar56._0_8_ = 0xff800000ff800000;
  auVar56._12_4_ = 0xff800000;
  auVar56._16_4_ = 0xff800000;
  auVar56._20_4_ = 0xff800000;
  auVar56._24_4_ = 0xff800000;
  auVar56._28_4_ = 0xff800000;
  auVar63 = vblendvps_avx(local_2760,auVar56,local_2b40);
  auVar49 = vpcmpeqd_avx2(local_2760,local_2760);
  auVar46 = ZEXT3264(auVar49);
  local_2760 = auVar63;
  goto LAB_019ce854;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }